

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaParser::ReadEffectColor(ColladaParser *this,aiColor4D *pColor,Sampler *pSampler)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *__s1;
  undefined4 extraout_var_03;
  char *profile;
  int _profile;
  undefined8 local_6c;
  uint local_64;
  char *pcStack_60;
  int attrTex;
  char *content;
  allocator local_41;
  undefined1 local_40 [8];
  string curElem;
  Sampler *pSampler_local;
  aiColor4D *pColor_local;
  ColladaParser *this_local;
  undefined4 extraout_var_02;
  
  curElem.field_2._8_8_ = pSampler;
  uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar2 & 1) == 0) {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_40,(char *)CONCAT44(extraout_var,iVar3),&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    do {
      do {
        while( true ) {
          uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((uVar2 & 1) == 0) goto LAB_00682029;
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar3 != 1) break;
          bVar1 = IsElement(this,"color");
          if (bVar1) {
            pcStack_60 = GetTextContent(this);
            pcStack_60 = fast_atoreal_move<float>(pcStack_60,&pColor->r,true);
            SkipSpacesAndLineEnd<char>(&stack0xffffffffffffffa0);
            pcStack_60 = fast_atoreal_move<float>(pcStack_60,&pColor->g,true);
            SkipSpacesAndLineEnd<char>(&stack0xffffffffffffffa0);
            pcStack_60 = fast_atoreal_move<float>(pcStack_60,&pColor->b,true);
            SkipSpacesAndLineEnd<char>(&stack0xffffffffffffffa0);
            pcStack_60 = fast_atoreal_move<float>(pcStack_60,&pColor->a,true);
            SkipSpacesAndLineEnd<char>(&stack0xffffffffffffffa0);
            TestClosing(this,"color");
          }
          else {
            bVar1 = IsElement(this,"texture");
            if (bVar1) {
              local_64 = GetAttribute(this,"texture");
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_64);
              std::__cxx11::string::operator=
                        ((string *)curElem.field_2._8_8_,(char *)CONCAT44(extraout_var_00,iVar3));
              local_64 = TestAttribute(this,"texcoord");
              if (-1 < (int)local_64) {
                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_64);
                std::__cxx11::string::operator=
                          ((string *)(curElem.field_2._8_8_ + 0x40),
                           (char *)CONCAT44(extraout_var_01,iVar3));
              }
              aiColor4t<float>::aiColor4t((aiColor4t<float> *)((long)&profile + 4),1.0,1.0,1.0,1.0);
              pColor->r = (float)profile._4_4_;
              pColor->g = (float)_profile;
              pColor->b = (float)(undefined4)local_6c;
              pColor->a = (float)local_6c._4_4_;
            }
            else {
              bVar1 = IsElement(this,"technique");
              if (bVar1) {
                profile._0_4_ = GetAttribute(this,"profile");
                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)(uint)profile)
                ;
                __s1 = (char *)CONCAT44(extraout_var_02,iVar3);
                iVar3 = strcmp(__s1,"MAYA");
                if (((iVar3 == 0) || (iVar3 = strcmp(__s1,"MAX3D"), iVar3 == 0)) ||
                   (iVar3 = strcmp(__s1,"OKINO"), iVar3 == 0)) {
                  ReadSamplerProperties(this,(Sampler *)curElem.field_2._8_8_);
                }
                else {
                  SkipElement(this);
                }
              }
              else {
                bVar1 = IsElement(this,"extra");
                if (!bVar1) {
                  SkipElement(this);
                }
              }
            }
          }
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar3 != 2);
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      bVar1 = std::operator==((char *)CONCAT44(extraout_var_03,iVar3),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40);
    } while (!bVar1);
LAB_00682029:
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void ColladaParser::ReadEffectColor(aiColor4D& pColor, Sampler& pSampler)
{
    if (mReader->isEmptyElement())
        return;

    // Save current element name
    const std::string curElem = mReader->getNodeName();

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("color"))
            {
                // text content contains 4 floats
                const char* content = GetTextContent();

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pColor.r);
                SkipSpacesAndLineEnd(&content);

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pColor.g);
                SkipSpacesAndLineEnd(&content);

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pColor.b);
                SkipSpacesAndLineEnd(&content);

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pColor.a);
                SkipSpacesAndLineEnd(&content);
                TestClosing("color");
            }
            else if (IsElement("texture"))
            {
                // get name of source texture/sampler
                int attrTex = GetAttribute("texture");
                pSampler.mName = mReader->getAttributeValue(attrTex);

                // get name of UV source channel. Specification demands it to be there, but some exporters
                // don't write it. It will be the default UV channel in case it's missing.
                attrTex = TestAttribute("texcoord");
                if (attrTex >= 0)
                    pSampler.mUVChannel = mReader->getAttributeValue(attrTex);
                //SkipElement();

                // as we've read texture, the color needs to be 1,1,1,1
                pColor = aiColor4D(1.f, 1.f, 1.f, 1.f);
            }
            else if (IsElement("technique"))
            {
                const int _profile = GetAttribute("profile");
                const char* profile = mReader->getAttributeValue(_profile);

                // Some extensions are quite useful ... ReadSamplerProperties processes
                // several extensions in MAYA, OKINO and MAX3D profiles.
                if (!::strcmp(profile, "MAYA") || !::strcmp(profile, "MAX3D") || !::strcmp(profile, "OKINO"))
                {
                    // get more information on this sampler
                    ReadSamplerProperties(pSampler);
                }
                else SkipElement();
            }
            else if (!IsElement("extra"))
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (mReader->getNodeName() == curElem)
                break;
        }
    }
}